

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::operator==(ProString *this,char *other)

{
  bool bVar1;
  qsizetype in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  QLatin1StringView *in_stack_ffffffffffffff78;
  QString *str;
  QStringView *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QStringView *pos;
  qsizetype local_48;
  storage_type_conflict *local_40;
  QLatin1String local_38;
  qsizetype local_28;
  storage_type_conflict *local_20;
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  str = &local_18;
  pos = in_RDI;
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff90,str);
  QVar2 = QStringView::mid((QStringView *)
                           CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                           (qsizetype)pos,in_RSI);
  local_48 = QVar2.m_size;
  local_40 = QVar2.m_data;
  local_28 = local_48;
  local_20 = local_40;
  QLatin1String::QLatin1String(&local_38,(char *)str);
  bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const char *other) const { return toQStringView() == QLatin1String(other); }